

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

size_t ByteStreamToBase64(uint8_t *InBuffer,size_t InCount,char *OutBuffer,size_t len)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  uchar *ps;
  ulong uVar7;
  int iVar8;
  
  sVar6 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = InCount;
  uVar5 = InCount % 3;
  iVar4 = SUB164(auVar3 / ZEXT816(3),0);
  iVar8 = iVar4 * 4 + 4;
  if (uVar5 == 0) {
    iVar8 = iVar4 * 4;
  }
  uVar7 = (ulong)iVar8;
  if (uVar7 <= len) {
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != (int)sVar6; sVar6 = sVar6 + 1) {
      bVar1 = *InBuffer;
      OutBuffer[sVar6 * 4] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[bVar1 >> 2];
      bVar2 = InBuffer[1];
      OutBuffer[sVar6 * 4 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
           [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
      bVar1 = InBuffer[2];
      InBuffer = InBuffer + 3;
      OutBuffer[sVar6 * 4 + 2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
           [(uint)(bVar1 >> 6) + (bVar2 & 0xf) * 4];
      OutBuffer[sVar6 * 4 + 3] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[bVar1 & 0x3f];
    }
    if (uVar5 == 2) {
      bVar1 = *InBuffer;
      OutBuffer[sVar6 * 4] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[bVar1 >> 2];
      bVar2 = InBuffer[1];
      OutBuffer[sVar6 * 4 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
           [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
      OutBuffer[sVar6 * 4 + 2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
           [(ulong)(bVar2 & 0xf) * 4];
    }
    else {
      if (uVar5 != 1) {
        return uVar7;
      }
      bVar1 = *InBuffer;
      OutBuffer[sVar6 * 4] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[bVar1 >> 2];
      OutBuffer[sVar6 * 4 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[(bVar1 & 3) << 4];
      OutBuffer[sVar6 * 4 + 2] = '=';
    }
    OutBuffer[sVar6 * 4 + 3] = '=';
    sVar6 = uVar7;
  }
  return sVar6;
}

Assistant:

size_t                                /* Number of bytes in the encoded buffer */
	ByteStreamToBase64 (
		    const uint8_t * InBuffer,           /* Input buffer, binary data */
		    size_t    InCount,              /* Number of bytes in the input buffer */
		    char  * OutBuffer,          /* output buffer */
		size_t len			   /* length of output buffer */
	)

	{
		unsigned char * ps;
		unsigned char * pd;
		unsigned char   acc_1;
		unsigned char   acc_2;
		int             i;
		int             n;
		int             m;
		size_t outCount;

		ps = (unsigned char *)InBuffer;
		n = InCount/3;
		m = InCount%3;
		if (!m)
		     outCount = 4*n;
		else
		     outCount = 4*(n+1);
		if (outCount > len) return 0;
		pd = (unsigned char *)OutBuffer;
		for ( i = 0; i<n; i++ ){
		     acc_1 = *ps++;
		     acc_2 = (acc_1<<4)&0x30;
		     acc_1 >>= 2;              /* base64 digit #1 */
		     *pd++ = T64[acc_1];
		     acc_1 = *ps++;
		     acc_2 |= acc_1 >> 4;      /* base64 digit #2 */
		     *pd++ = T64[acc_2];
		     acc_1 &= 0x0f;
		     acc_1 <<=2;
		     acc_2 = *ps++;
		     acc_1 |= acc_2>>6;        /* base64 digit #3 */
		     *pd++ = T64[acc_1];
		     acc_2 &= 0x3f;            /* base64 digit #4 */
		     *pd++ = T64[acc_2];
		}
		if ( m == 1 ){
		     acc_1 = *ps++;
		     acc_2 = (acc_1<<4)&0x3f;  /* base64 digit #2 */
		     acc_1 >>= 2;              /* base64 digit #1 */
		     *pd++ = T64[acc_1];
		     *pd++ = T64[acc_2];
		     *pd++ = P64;
		     *pd++ = P64;

		}
		else if ( m == 2 ){
		     acc_1 = *ps++;
		     acc_2 = (acc_1<<4)&0x3f;
		     acc_1 >>= 2;              /* base64 digit #1 */
		     *pd++ = T64[acc_1];
		     acc_1 = *ps++;
		     acc_2 |= acc_1 >> 4;      /* base64 digit #2 */
		     *pd++ = T64[acc_2];
		     acc_1 &= 0x0f;
		     acc_1 <<=2;               /* base64 digit #3 */
		     *pd++ = T64[acc_1];
		     *pd++ = P64;
		}

		return outCount;
	}